

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_m2mf.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::M2mf::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,M2mf *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  MthdM2mfPitch *pMVar2;
  MthdM2mfOffset *pMVar3;
  MthdDmaGrobj *pMVar4;
  SingleMthdTest *pSVar5;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar6;
  result_type rVar7;
  Test *pTVar8;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_2c1;
  MthdM2mfPitch *local_2c0;
  MthdM2mfPitch *local_2b8;
  MthdM2mfOffset *local_2b0;
  MthdM2mfOffset *local_2a8;
  MthdDmaGrobj *local_2a0;
  MthdDmaGrobj *local_298;
  Test *local_290;
  Test *local_288;
  Test *local_280;
  SingleMthdTest *local_278;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_270;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_268;
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  undefined1 *local_240;
  long local_238;
  undefined1 local_230 [16];
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0 [16];
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  SingleMthdTest *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  MthdDmaGrobj *local_80;
  MthdDmaGrobj *local_78;
  MthdM2mfOffset *local_70;
  MthdM2mfOffset *local_68;
  MthdM2mfPitch *local_60;
  MthdM2mfPitch *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  local_268 = __return_storage_ptr__;
  local_278 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"nop","");
  pSVar5 = local_278;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_278,opt,(uint32_t)rVar7);
  (pSVar5->super_MthdTest).trapbit = -1;
  (pSVar5->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar5->s_cls = uVar1;
  pSVar5->s_mthd = 0x100;
  pSVar5->s_stride = 4;
  pSVar5->s_num = 1;
  pSVar5->s_trapbit = -1;
  (pSVar5->name)._M_dataplus._M_p = (pointer)&(pSVar5->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar5->name,local_180,local_180 + local_178)
  ;
  (pSVar5->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_a0 = pSVar5;
  local_280 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"notify","");
  pTVar8 = local_280;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_280,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_1a0,local_1a0 + local_198);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_98 = pTVar8;
  local_288 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"pm_trigger","");
  pTVar8 = local_288;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_288,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_1c0,local_1c0 + local_1b8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_90 = pTVar8;
  local_290 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"dma_notify","");
  pTVar8 = local_290;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_290,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 1;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_1e0,local_1e0 + local_1d8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_88 = pTVar8;
  local_298 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"dma_in","");
  pMVar4 = local_298;
  MthdDmaGrobj::MthdDmaGrobj
            (local_298,opt,(uint32_t)rVar7,&local_c0,2,(this->super_Class).cls,0x184,0,2);
  local_80 = pMVar4;
  local_2a0 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"dma_out","");
  pMVar4 = local_2a0;
  MthdDmaGrobj::MthdDmaGrobj
            (local_2a0,opt,(uint32_t)rVar7,&local_e0,3,(this->super_Class).cls,0x188,1,9);
  local_78 = pMVar4;
  local_2a8 = (MthdM2mfOffset *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"offset_in","");
  pMVar3 = local_2a8;
  anon_unknown_8::MthdM2mfOffset::MthdM2mfOffset
            (local_2a8,opt,(uint32_t)rVar7,&local_100,4,(this->super_Class).cls,0x30c,0);
  local_70 = pMVar3;
  local_2b0 = (MthdM2mfOffset *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"offset_out","");
  pMVar3 = local_2b0;
  anon_unknown_8::MthdM2mfOffset::MthdM2mfOffset
            (local_2b0,opt,(uint32_t)rVar7,&local_120,5,(this->super_Class).cls,0x310,1);
  local_68 = pMVar3;
  local_2b8 = (MthdM2mfPitch *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"pitch_in","");
  pMVar2 = local_2b8;
  anon_unknown_8::MthdM2mfPitch::MthdM2mfPitch
            (local_2b8,opt,(uint32_t)rVar7,&local_140,6,(this->super_Class).cls,0x314,0);
  local_60 = pMVar2;
  local_2c0 = (MthdM2mfPitch *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"pitch_out","");
  pMVar2 = local_2c0;
  anon_unknown_8::MthdM2mfPitch::MthdM2mfPitch
            (local_2c0,opt,(uint32_t)rVar7,&local_160,7,(this->super_Class).cls,0x318,1);
  local_58 = pMVar2;
  pTVar8 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"line_length","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x31c;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 8;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_200,local_200 + local_1f8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034e0d8;
  local_50 = pTVar8;
  pTVar8 = (Test *)operator_new(0x25950);
  local_270 = this_00;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"line_count","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 800;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 9;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_220,local_220 + local_218);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034e1d0;
  local_48 = pTVar8;
  pTVar8 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_270);
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"format","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x324;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 10;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_240,local_240 + local_238);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034e2c8;
  local_40 = pTVar8;
  pTVar8 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_270);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"trigger","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x328;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_260,local_260 + local_258);
  pvVar6 = local_268;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034e3c0;
  __l._M_len = 0xe;
  __l._M_array = &local_a0;
  local_38 = pTVar8;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_268,__l,&local_2c1);
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  return pvVar6;
}

Assistant:

std::vector<SingleMthdTest *> M2mf::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_in", 2, cls, 0x184, 0, DMA_R | DMA_CLR),
		new MthdDmaGrobj(opt, rnd(), "dma_out", 3, cls, 0x188, 1, DMA_W | DMA_CHECK_PREV),
		new MthdM2mfOffset(opt, rnd(), "offset_in", 4, cls, 0x30c, 0),
		new MthdM2mfOffset(opt, rnd(), "offset_out", 5, cls, 0x310, 1),
		new MthdM2mfPitch(opt, rnd(), "pitch_in", 6, cls, 0x314, 0),
		new MthdM2mfPitch(opt, rnd(), "pitch_out", 7, cls, 0x318, 1),
		new MthdM2mfLineLength(opt, rnd(), "line_length", 8, cls, 0x31c),
		new MthdM2mfLineCount(opt, rnd(), "line_count", 9, cls, 0x320),
		new MthdM2mfFormat(opt, rnd(), "format", 10, cls, 0x324),
		new MthdM2mfTrigger(opt, rnd(), "trigger", 11, cls, 0x328),
	};
}